

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-ekf-flexibility-estimation.hxx
# Opt level: O1

IndexedMatrixArray *
stateObservation::examples::offlineEKFFlexibilityEstimation
          (IndexedMatrixArray *y,Matrix *xh0,uint numberOfContacts,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *contactsPositions,double dt)

{
  uint uVar1;
  long lVar2;
  IndexedMatrixArray *in_R8;
  uint k;
  IndexedMatrixArray u;
  undefined8 local_b8 [2];
  undefined8 local_a8;
  void *local_a0 [3];
  undefined1 local_88 [88];
  
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_88);
  lVar2 = xh0[3].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  k = 0xffffffff;
  if ((xh0[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows -
       xh0[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols >> 3
      ) * -0x5555555555555555 +
      ((lVar2 - (long)xh0[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data >> 3) + -1 + (ulong)(lVar2 == 0)) * 0x15 !=
      (xh0[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols -
       (long)xh0[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data >> 3) * 0x5555555555555555) {
    k = *(int *)&(xh0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data - 1;
  }
  while( true ) {
    lVar2 = xh0[3].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
    ;
    lVar2 = (xh0[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols - (long)xh0[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data >> 3) * -0x5555555555555555 +
            (xh0[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows - xh0[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols >> 3) * -0x5555555555555555 +
            ((lVar2 - (long)xh0[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data >> 3) + -1 + (ulong)(lVar2 == 0)) * 0x15;
    uVar1 = *(int *)&(xh0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data + -1 + (int)lVar2;
    if (lVar2 == 0) {
      uVar1 = 0;
    }
    if (uVar1 < k) break;
    local_b8[0] = 0xf;
    local_a8 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a0,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_b8);
    IndexedMatrixArray::setValue((IndexedMatrixArray *)local_88,(Matrix *)local_a0,k);
    free(local_a0[0]);
    k = k + 1;
  }
  offlineEKFFlexibilityEstimation
            (y,(IndexedMatrixArray *)xh0,(Matrix *)local_88,numberOfContacts,
             (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)((ulong)contactsPositions & 0xffffffff),0.0,in_R8,(IndexedMatrixArray *)0x0);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)(local_88 + 8));
  return y;
}

Assistant:

stateObservation::IndexedMatrixArray offlineEKFFlexibilityEstimation(
            const stateObservation::IndexedMatrixArray & y,
            const Matrix & xh0,
            unsigned numberOfContacts,
            const std::vector<Vector3, Eigen::aligned_allocator<Vector3> > & contactsPositions,
            double dt)
{
    const unsigned inputSize=15;

    ///initialization of a zero input
    stateObservation::IndexedMatrixArray u;
    for (unsigned k=y.getFirstIndex()-1; k<=y.getLastIndex(); ++k)
    {
        u.setValue(Vector::Zero(inputSize,1),k);
    }

    return offlineEKFFlexibilityEstimation
                        (y, u, xh0, numberOfContacts, contactsPositions, dt);
}